

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O1

Aig_ManPack_t * Aig_ManPackAlloc(Aig_Man_t *pAig)

{
  int iVar1;
  Aig_ManPack_t *pAVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  word *__s;
  int iVar5;
  
  pAVar2 = (Aig_ManPack_t *)calloc(1,0x38);
  pAVar2->pAig = pAig;
  iVar1 = pAig->vObjs->nSize;
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = iVar1;
  if (iVar1 - 1U < 0xf) {
    iVar5 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    pwVar4 = (word *)0x0;
  }
  else {
    pwVar4 = (word *)malloc((long)iVar5 << 3);
  }
  pVVar3->pArray = pwVar4;
  pVVar3->nSize = iVar1;
  __s = (word *)0x0;
  memset(pwVar4,0,(long)iVar1 << 3);
  pAVar2->vSigns = pVVar3;
  iVar1 = pAig->nObjs[2];
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 != 0) {
    __s = (word *)malloc((long)iVar5 * 8);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar1;
  pwVar4 = (word *)0x0;
  memset(__s,0,(long)iVar1 << 3);
  pAVar2->vPiPats = pVVar3;
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 != 0) {
    pwVar4 = (word *)malloc((long)iVar5 << 3);
  }
  pVVar3->pArray = pwVar4;
  pVVar3->nSize = iVar1;
  memset(pwVar4,0,(long)iVar1 << 3);
  pAVar2->vPiCare = pVVar3;
  pAVar2->iPatCur = 1;
  return pAVar2;
}

Assistant:

Aig_ManPack_t * Aig_ManPackAlloc( Aig_Man_t * pAig )
{
    Aig_ManPack_t * p;
    p = ABC_CALLOC( Aig_ManPack_t, 1 );
    p->pAig    = pAig;
    p->vSigns  = Vec_WrdStart( Aig_ManObjNumMax(pAig) );
    p->vPiPats = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->vPiCare = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->iPatCur = 1;
    return p;
}